

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O0

int cmd_cat2(char *args)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  undefined8 uVar4;
  void *__ptr;
  long lVar5;
  void *__ptr_00;
  bool bVar6;
  PHYSFS_sint64 rc;
  char *pcStack_70;
  int readlen;
  size_t i;
  char *ptr_1;
  size_t buffer2len;
  char *buffer2;
  size_t buffer1len;
  char *buffer1;
  char *ptr;
  char *fname2;
  char *fname1;
  PHYSFS_File *f2;
  PHYSFS_File *f1;
  char *args_local;
  
  fname1 = (char *)0x0;
  if (*args == '\"') {
    fname2 = args + 1;
    buffer1 = strchr(fname2,0x22);
    if (buffer1 == (char *)0x0) {
      printf("missing string terminator in argument.\n");
      return 1;
    }
    *buffer1 = '\0';
  }
  else {
    buffer1 = strchr(args,0x20);
    *buffer1 = '\0';
    fname2 = args;
  }
  ptr = buffer1 + 1;
  if (*ptr == '\"') {
    ptr = buffer1 + 2;
    pcVar2 = strchr(ptr,0x22);
    if (pcVar2 == (char *)0x0) {
      printf("missing string terminator in argument.\n");
      return 1;
    }
    *pcVar2 = '\0';
  }
  lVar3 = PHYSFS_openRead(fname2);
  if (lVar3 == 0) {
    uVar4 = PHYSFS_getLastError();
    printf("failed to open \'%s\'. Reason: [%s].\n",fname2,uVar4);
  }
  else {
    fname1 = (char *)PHYSFS_openRead(ptr);
    if (fname1 == (char *)0x0) {
      uVar4 = PHYSFS_getLastError();
      printf("failed to open \'%s\'. Reason: [%s].\n",ptr,uVar4);
    }
    else {
      buffer1len = 0;
      buffer2 = (char *)0x0;
      buffer2len = 0;
      ptr_1 = (char *)0x0;
      if (do_buffer_size != 0) {
        iVar1 = PHYSFS_setBuffer(lVar3,do_buffer_size);
        if (iVar1 == 0) {
          uVar4 = PHYSFS_getLastError();
          printf("failed to set file buffer for \'%s\'. Reason: [%s].\n",fname2,uVar4);
          PHYSFS_close(lVar3);
          PHYSFS_close(fname1);
          return 1;
        }
        iVar1 = PHYSFS_setBuffer(fname1,do_buffer_size);
        if (iVar1 == 0) {
          uVar4 = PHYSFS_getLastError();
          printf("failed to set file buffer for \'%s\'. Reason: [%s].\n",ptr,uVar4);
          PHYSFS_close(lVar3);
          PHYSFS_close(fname1);
          return 1;
        }
      }
      do {
        __ptr = realloc((void *)buffer1len,(size_t)(buffer2 + 0x80));
        if (__ptr == (void *)0x0) {
          printf("(Out of memory.)\n\n");
          free((void *)buffer1len);
          free((void *)buffer2len);
          PHYSFS_close(lVar3);
          PHYSFS_close(fname1);
          return 1;
        }
        lVar5 = PHYSFS_readBytes(lVar3,(char *)((long)__ptr + (long)buffer2),0x80);
        if (lVar5 < 0) {
          uVar4 = PHYSFS_getLastError();
          printf("(Error condition in reading \'%s\'. Reason: [%s])\n\n",fname2,uVar4);
          free(__ptr);
          free((void *)buffer2len);
          PHYSFS_close(lVar3);
          PHYSFS_close(fname1);
          return 1;
        }
        buffer2 = buffer2 + lVar5;
        __ptr_00 = realloc((void *)buffer2len,(size_t)(ptr_1 + 0x80));
        if (__ptr_00 == (void *)0x0) {
          printf("(Out of memory.)\n\n");
          free(__ptr);
          free((void *)buffer2len);
          PHYSFS_close(lVar3);
          PHYSFS_close(fname1);
          return 1;
        }
        lVar5 = PHYSFS_readBytes(fname1,(char *)((long)__ptr_00 + (long)ptr_1),0x80);
        if (lVar5 < 0) {
          uVar4 = PHYSFS_getLastError();
          printf("(Error condition in reading \'%s\'. Reason: [%s])\n\n",ptr,uVar4);
          free(__ptr);
          free(__ptr_00);
          PHYSFS_close(lVar3);
          PHYSFS_close(fname1);
          return 1;
        }
        ptr_1 = ptr_1 + lVar5;
        iVar1 = PHYSFS_eof(lVar3);
        bVar6 = true;
        if (iVar1 != 0) {
          iVar1 = PHYSFS_eof(fname1);
          bVar6 = iVar1 == 0;
        }
        buffer2len = (size_t)__ptr_00;
        buffer1len = (size_t)__ptr;
      } while (bVar6);
      printf("file \'%s\' ...\n\n",fname2);
      for (pcStack_70 = (char *)0x0; pcStack_70 < buffer2; pcStack_70 = pcStack_70 + 1) {
        fputc((int)*(char *)((long)__ptr + (long)pcStack_70),_stdout);
      }
      free(__ptr);
      printf("\n\nfile \'%s\' ...\n\n",ptr);
      for (pcStack_70 = (char *)0x0; pcStack_70 < ptr_1; pcStack_70 = pcStack_70 + 1) {
        fputc((int)*(char *)((long)__ptr_00 + (long)pcStack_70),_stdout);
      }
      free(__ptr_00);
      printf("\n\n");
    }
  }
  if (lVar3 != 0) {
    PHYSFS_close(lVar3);
  }
  if (fname1 != (char *)0x0) {
    PHYSFS_close(fname1);
  }
  return 1;
}

Assistant:

static int cmd_cat2(char *args)
{
    PHYSFS_File *f1 = NULL;
    PHYSFS_File *f2 = NULL;
    char *fname1;
    char *fname2;
    char *ptr;

    fname1 = args;
    if (*fname1 == '\"')
    {
        fname1++;
        ptr = strchr(fname1, '\"');
        if (ptr == NULL)
        {
            printf("missing string terminator in argument.\n");
            return 1;
        } /* if */
        *(ptr) = '\0';
    } /* if */
    else
    {
        ptr = strchr(fname1, ' ');
        *ptr = '\0';
    } /* else */

    fname2 = ptr + 1;
    if (*fname2 == '\"')
    {
        fname2++;
        ptr = strchr(fname2, '\"');
        if (ptr == NULL)
        {
            printf("missing string terminator in argument.\n");
            return 1;
        } /* if */
        *(ptr) = '\0';
    } /* if */

    if ((f1 = PHYSFS_openRead(fname1)) == NULL)
        printf("failed to open '%s'. Reason: [%s].\n", fname1, PHYSFS_getLastError());
    else if ((f2 = PHYSFS_openRead(fname2)) == NULL)
        printf("failed to open '%s'. Reason: [%s].\n", fname2, PHYSFS_getLastError());
    else
    {
        char *buffer1 = NULL;
        size_t buffer1len = 0;
        char *buffer2 = NULL;
        size_t buffer2len = 0;
        char *ptr = NULL;
        size_t i;

        if (do_buffer_size)
        {
            if (!PHYSFS_setBuffer(f1, do_buffer_size))
            {
                printf("failed to set file buffer for '%s'. Reason: [%s].\n",
                        fname1, PHYSFS_getLastError());
                PHYSFS_close(f1);
                PHYSFS_close(f2);
                return 1;
            } /* if */
            else if (!PHYSFS_setBuffer(f2, do_buffer_size))
            {
                printf("failed to set file buffer for '%s'. Reason: [%s].\n",
                        fname2, PHYSFS_getLastError());
                PHYSFS_close(f1);
                PHYSFS_close(f2);
                return 1;
            } /* if */
        } /* if */


        do
        {
            int readlen = 128;
            PHYSFS_sint64 rc;

            ptr = realloc(buffer1, buffer1len + readlen);
            if (!ptr)
            {
                printf("(Out of memory.)\n\n");
                free(buffer1);
                free(buffer2);
                PHYSFS_close(f1);
                PHYSFS_close(f2);
                return 1;
            } /* if */

            buffer1 = ptr;
            rc = PHYSFS_readBytes(f1, buffer1 + buffer1len, readlen);
            if (rc < 0)
            {
                printf("(Error condition in reading '%s'. Reason: [%s])\n\n",
                       fname1, PHYSFS_getLastError());
                free(buffer1);
                free(buffer2);
                PHYSFS_close(f1);
                PHYSFS_close(f2);
                return 1;
            } /* if */
            buffer1len += (size_t) rc;

            ptr = realloc(buffer2, buffer2len + readlen);
            if (!ptr)
            {
                printf("(Out of memory.)\n\n");
                free(buffer1);
                free(buffer2);
                PHYSFS_close(f1);
                PHYSFS_close(f2);
                return 1;
            } /* if */

            buffer2 = ptr;
            rc = PHYSFS_readBytes(f2, buffer2 + buffer2len, readlen);
            if (rc < 0)
            {
                printf("(Error condition in reading '%s'. Reason: [%s])\n\n",
                       fname2, PHYSFS_getLastError());
                free(buffer1);
                free(buffer2);
                PHYSFS_close(f1);
                PHYSFS_close(f2);
                return 1;
            } /* if */
            buffer2len += (size_t) rc;
        } while (!PHYSFS_eof(f1) || !PHYSFS_eof(f2));

        printf("file '%s' ...\n\n", fname1);
        for (i = 0; i < buffer1len; i++)
            fputc((int) buffer1[i], stdout);
        free(buffer1);

        printf("\n\nfile '%s' ...\n\n", fname2);
        for (i = 0; i < buffer2len; i++)
            fputc((int) buffer2[i], stdout);
        free(buffer2);

        printf("\n\n");
    } /* else */

    if (f1)
        PHYSFS_close(f1);

    if (f2)
        PHYSFS_close(f2);

    return 1;
}